

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O1

void __thiscall xercesc_4_0::CMStateSet::allocateChunk(CMStateSet *this,XMLSize_t index)

{
  MemoryManager *pMVar1;
  int iVar2;
  XMLInt32 *in_RAX;
  undefined4 extraout_var;
  XMLInt32 *local_18;
  
  if (XMLPlatformUtils::fgSSE2ok == '\x01') {
    local_18 = in_RAX;
    iVar2 = posix_memalign(&local_18,0x10,0x80);
    if (iVar2 != 0) {
      local_18 = (XMLInt32 *)0x0;
    }
  }
  else {
    pMVar1 = this->fDynamicBuffer->fMemoryManager;
    iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x80);
    local_18 = (XMLInt32 *)CONCAT44(extraout_var,iVar2);
  }
  this->fDynamicBuffer->fBitArray[index] = local_18;
  return;
}

Assistant:

void allocateChunk(const XMLSize_t index)
    {
#ifdef XERCES_HAVE_SSE2_INTRINSIC
        if(XMLPlatformUtils::fgSSE2ok)
            fDynamicBuffer->fBitArray[index]=(XMLInt32*)_mm_malloc(CMSTATE_BITFIELD_INT32_SIZE * sizeof(XMLInt32), 16);
        else
#endif
            fDynamicBuffer->fBitArray[index]=(XMLInt32*)fDynamicBuffer->fMemoryManager->allocate(CMSTATE_BITFIELD_INT32_SIZE * sizeof(XMLInt32));
    }